

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_cam_b3lyp.c
# Opt level: O1

void cam_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double omega;
  undefined4 local_28;
  undefined4 uStack_24;
  double local_18;
  
  dVar2 = get_ext_param(p,ext_params,0);
  dVar3 = get_ext_param(p,ext_params,1);
  local_18 = get_ext_param(p,ext_params,2);
  pdVar1 = p->mix_coef;
  *pdVar1 = 1.0 - dVar2;
  local_28 = SUB84(dVar3,0);
  uStack_24 = (undefined4)((ulong)dVar3 >> 0x20);
  pdVar1[1] = -dVar3;
  p->cam_omega = local_18;
  p->cam_alpha = dVar2;
  *(undefined4 *)&p->cam_beta = local_28;
  *(undefined4 *)((long)&p->cam_beta + 4) = uStack_24;
  xc_func_set_ext_params(p->func_aux[1],&local_18);
  return;
}

Assistant:

static void
cam_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double alpha, beta, omega;

  assert(p != NULL);
  alpha  = get_ext_param(p, ext_params, 0);
  beta   = get_ext_param(p, ext_params, 1);
  omega  = get_ext_param(p, ext_params, 2);

  p->mix_coef[0] = 1.0 - alpha;
  p->mix_coef[1] = -beta;

  xc_func_set_ext_params_name(p->func_aux[1], "_omega", omega);
  set_ext_params_cam(p, ext_params);
}